

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

bool __thiscall
GEO::FileSystem::MemoryNode::get_directory_entries
          (MemoryNode *this,string *path,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result)

{
  _Rb_tree_header *p_Var1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 uVar4;
  int iVar5;
  iterator iVar6;
  MemoryNode *pMVar7;
  _Base_ptr p_Var8;
  string rest;
  string subdir;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>
  it;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>
  local_58;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  split_path(path,&local_98,&local_b8);
  iVar5 = std::__cxx11::string::compare((char *)&local_98);
  if ((iVar5 == 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_b8), iVar5 == 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(result);
    p_Var8 = (this->subnodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->subnodes_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var8 != p_Var1) {
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>
        ::pair(&local_58,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>
                *)(p_Var8 + 1));
        std::operator+(&local_78,&this->path_,&local_58.first);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,
                   &local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        if (local_58.second.pointer_ != (MemoryNode *)0x0) {
          piVar2 = &((local_58.second.pointer_)->super_Node).super_Counted.nb_refs_;
          *piVar2 = *piVar2 + -1;
          if (*piVar2 == 0) {
            (*((local_58.second.pointer_)->super_Node).super_Counted._vptr_Counted[1])();
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.first._M_dataplus._M_p != &local_58.first.field_2) {
          operator_delete(local_58.first._M_dataplus._M_p);
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var1);
    }
    p_Var8 = (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->files_)._M_t._M_impl.super__Rb_tree_header;
    uVar4 = 1;
    if ((_Rb_tree_header *)p_Var8 != p_Var1) {
      paVar3 = &local_58.first.field_2;
      do {
        local_58.first._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,*(long *)(p_Var8 + 1),
                   (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
        local_58.second.pointer_ = *(MemoryNode **)(p_Var8 + 2);
        std::operator+(&local_78,&this->path_,&local_58.first);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,
                   &local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.first._M_dataplus._M_p != paVar3) {
          operator_delete(local_58.first._M_dataplus._M_p);
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var1);
      uVar4 = 1;
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_98);
    if (iVar5 == 0) {
      std::__cxx11::string::_M_assign((string *)&local_98);
      std::__cxx11::string::_M_replace
                ((ulong)&local_b8,0,(char *)local_b8._M_string_length,0x18fcbb);
    }
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>_>_>
            ::find(&(this->subnodes_)._M_t,&local_98);
    if ((_Rb_tree_header *)iVar6._M_node == &(this->subnodes_)._M_t._M_impl.super__Rb_tree_header) {
      uVar4 = 0;
    }
    else {
      pMVar7 = SmartPointer<GEO::FileSystem::MemoryNode>::operator->
                         ((SmartPointer<GEO::FileSystem::MemoryNode> *)(iVar6._M_node + 2));
      iVar5 = (*(pMVar7->super_Node).super_Counted._vptr_Counted[7])(pMVar7,&local_b8,result);
      uVar4 = (undefined1)iVar5;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return (bool)uVar4;
}

Assistant:

bool MemoryNode::get_directory_entries(
	    const std::string& path, std::vector<std::string>& result
	) {
	    std::string subdir;
	    std::string rest;
	    split_path(path, subdir, rest);
	    if(subdir == "" && rest == "") {
		result.clear();
		for(auto it : subnodes_) {
		    result.push_back(path_ + it.first);
		}
		for(auto it : files_) {
		    result.push_back(path_ + it.first);
		}
		return true;
	    } else {
		if(subdir == "") {
		    subdir = rest;
		    rest = "";
		}
		auto it = subnodes_.find(subdir);
		if(it == subnodes_.end()) {
		    return false;
		}
		return it->second->get_directory_entries(rest, result);
	    }
	}